

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

void __thiscall Encoder::SaveLazyBailOutJitTransferData(Encoder *this)

{
  code *pcVar1;
  InProcNativeEntryPointData *this_00;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  Memory *this_01;
  EntryPointInfo *pEVar6;
  JitTransferData *this_02;
  int *local_68;
  PropertyId *dstProperties;
  undefined8 local_58;
  TrackAllocData local_50;
  int *local_28;
  PropertyId *lazyBailoutProperties;
  InProcNativeEntryPointData *pIStack_18;
  int count;
  InProcNativeEntryPointData *nativeEntryPointData;
  Encoder *this_local;
  
  nativeEntryPointData = (InProcNativeEntryPointData *)this;
  bVar2 = Func::HasLazyBailOut(this->m_func);
  if (bVar2) {
    iVar3 = JsUtil::ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>::Count
                      (&this->m_sortedLazyBailoutRecordList->
                        super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>
                      );
    if (iVar3 < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69c,"(this->m_sortedLazyBailoutRecordList->Count() > 0)",
                         "this->m_sortedLazyBailoutRecordList->Count() > 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (this->m_lazyBailOutThunkOffset == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69d,"(this->m_lazyBailOutThunkOffset != 0)",
                         "this->m_lazyBailOutThunkOffset != 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar5 = Func::GetLazyBailOutRecordSlot(this->m_func);
    if (pSVar5 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69e,"(this->m_func->GetLazyBailOutRecordSlot() != nullptr)",
                         "this->m_func->GetLazyBailOutRecordSlot() != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pEVar6 = Func::GetInProcJITEntryPointInfo(this->m_func);
    pIStack_18 = Js::EntryPointInfo::GetInProcNativeEntryPointData(pEVar6);
    InProcNativeEntryPointData::SetSortedLazyBailOutRecordList
              (pIStack_18,this->m_sortedLazyBailoutRecordList);
    this_00 = pIStack_18;
    pSVar5 = Func::GetLazyBailOutRecordSlot(this->m_func);
    InProcNativeEntryPointData::SetLazyBailOutRecordSlotOffset(this_00,pSVar5->m_offset);
    InProcNativeEntryPointData::SetLazyBailOutThunkOffset(pIStack_18,this->m_lazyBailOutThunkOffset)
    ;
  }
  iVar3 = JsUtil::
          BaseHashSet<int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Count(&this->m_func->lazyBailoutProperties);
  if (0 < iVar3) {
    lazyBailoutProperties._4_4_ =
         JsUtil::
         BaseHashSet<int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         ::Count(&this->m_func->lazyBailoutProperties);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&int::typeinfo,0,(long)lazyBailoutProperties._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
               ,0x6a9);
    this_01 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_50);
    dstProperties = (PropertyId *)Memory::HeapAllocator::AllocZero;
    local_58 = 0;
    local_68 = Memory::AllocateArray<Memory::HeapAllocator,int,false>
                         (this_01,(HeapAllocator *)Memory::HeapAllocator::AllocZero,0,
                          (long)lazyBailoutProperties._4_4_);
    local_28 = local_68;
    JsUtil::
    BaseHashSet<int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
    ::Map<Encoder::SaveLazyBailOutJitTransferData()::__0>
              ((BaseHashSet<int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                *)&this->m_func->lazyBailoutProperties,(anon_class_8_1_483b9af8_for_fn)&local_68);
    pEVar6 = Func::GetInProcJITEntryPointInfo(this->m_func);
    this_02 = Js::EntryPointInfo::GetJitTransferData(pEVar6);
    JitTransferData::SetLazyBailoutProperties(this_02,local_28,lazyBailoutProperties._4_4_);
  }
  return;
}

Assistant:

void
Encoder::SaveLazyBailOutJitTransferData()
{
    if (this->m_func->HasLazyBailOut())
    {
        Assert(this->m_sortedLazyBailoutRecordList->Count() > 0);
        Assert(this->m_lazyBailOutThunkOffset != 0);
        Assert(this->m_func->GetLazyBailOutRecordSlot() != nullptr);

        auto nativeEntryPointData = this->m_func->GetInProcJITEntryPointInfo()->GetInProcNativeEntryPointData();
        nativeEntryPointData->SetSortedLazyBailOutRecordList(this->m_sortedLazyBailoutRecordList);
        nativeEntryPointData->SetLazyBailOutRecordSlotOffset(this->m_func->GetLazyBailOutRecordSlot()->m_offset);
        nativeEntryPointData->SetLazyBailOutThunkOffset(this->m_lazyBailOutThunkOffset);
    }

    if (this->m_func->lazyBailoutProperties.Count() > 0)
    {
        const int count = this->m_func->lazyBailoutProperties.Count();
        Js::PropertyId* lazyBailoutProperties = HeapNewArrayZ(Js::PropertyId, count);
        Js::PropertyId* dstProperties = lazyBailoutProperties;
        this->m_func->lazyBailoutProperties.Map([&](Js::PropertyId propertyId)
        {
            *dstProperties++ = propertyId;
        });
        this->m_func->GetInProcJITEntryPointInfo()->GetJitTransferData()->SetLazyBailoutProperties(lazyBailoutProperties, count);
    }
}